

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall
QDateTimeEditPrivate::setSelected(QDateTimeEditPrivate *this,int sectionIndex,bool forward)

{
  QLineEdit *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long in_FS_OFFSET;
  SectionNode SVar5;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QAbstractSpinBoxPrivate::specialValue(&this->super_QAbstractSpinBoxPrivate);
  if (bVar1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QLineEdit::selectAll((this->super_QAbstractSpinBoxPrivate).edit);
      return;
    }
  }
  else {
    iVar3 = (int)&this->super_QDateTimeParser;
    piVar4 = (int *)QDateTimeParser::sectionNode(iVar3);
    iVar2 = *piVar4;
    if (((iVar2 != 0) && (iVar2 != 0x30000)) && (iVar2 != 0x50000)) {
      (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
                (&local_50,this);
      updateCache(this,&(this->super_QAbstractSpinBoxPrivate).value,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      iVar2 = QDateTimeParser::sectionSize(iVar3);
      this_00 = (this->super_QAbstractSpinBoxPrivate).edit;
      SVar5.count = piVar4[0];
      SVar5.zeroesAdded = piVar4[1];
      SVar5._0_8_ = &this->super_QDateTimeParser;
      iVar3 = QDateTimeParser::sectionPos(SVar5);
      if (!forward) {
        iVar3 = iVar3 + iVar2;
        iVar2 = -iVar2;
      }
      QLineEdit::setSelection(this_00,iVar3,iVar2);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::setSelected(int sectionIndex, bool forward)
{
    if (specialValue()
#ifdef QT_KEYPAD_NAVIGATION
        || (QApplicationPrivate::keypadNavigationEnabled() && !edit->hasEditFocus())
#endif
        ) {
        edit->selectAll();
    } else {
        const SectionNode &node = sectionNode(sectionIndex);
        if (node.type == NoSection || node.type == LastSection || node.type == FirstSection)
            return;

        updateCache(value, displayText());
        const int size = sectionSize(sectionIndex);
        if (forward) {
            edit->setSelection(sectionPos(node), size);
        } else {
            edit->setSelection(sectionPos(node) + size, -size);
        }
    }
}